

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Gemm_x86_avx512::forward
          (Gemm_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int *piVar18;
  ulong uVar19;
  pointer pMVar20;
  ulong uVar21;
  int iVar22;
  size_t sVar23;
  pointer pMVar24;
  uint uVar25;
  int max_kk;
  Mat *pMVar26;
  Allocator *pAVar27;
  ulong uVar28;
  Allocator *pAVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  void *pvVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  int TILE_K;
  Mat *local_308;
  pointer local_300;
  Mat *local_2f8;
  int TILE_K_1;
  ulong local_2e8;
  int local_2dc;
  pointer local_2d8;
  int local_2cc;
  Allocator *local_2c8;
  Allocator *local_2b8;
  Allocator *local_2a0;
  ulong local_298;
  Mat *local_290;
  Mat local_288;
  ulong local_240;
  Mat local_238;
  Mat local_1e8;
  ulong local_198;
  int TILE_K_3;
  Mat local_188;
  ulong local_138;
  Gemm_x86_avx512 *local_130;
  Mat local_128;
  int TILE_M;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  int local_c0;
  Allocator *local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  int local_a0;
  size_t local_98;
  int TILE_N;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  int local_70;
  Allocator *local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  int local_50;
  size_t local_48;
  ulong local_38;
  
  p_Var1 = this->_vptr_Gemm_x86_avx512[-3];
  iVar32 = *(int *)((long)&(this->CT_data).cstep + (long)p_Var1);
  if (iVar32 == 0) {
LAB_004e56f5:
    pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar32 = *(int *)((long)&(this->CT_data).c + (long)p_Var1);
    if (*(int *)((long)&(this->CT_data).cstep + (long)(p_Var1 + 4)) == 0) {
      if (iVar32 == 0) {
        uVar12 = pMVar20->elempack * (&pMVar20->h)[(ulong)(pMVar20->dims == 3) * 2];
      }
      else {
        uVar12 = pMVar20->w;
      }
      if (*(int *)(&(this->CT_data).field_0x3c + (long)p_Var1) == 0) {
        uVar30 = pMVar20[1].w;
      }
      else {
        uVar30 = pMVar20[1].elempack * (&pMVar20[1].h)[(ulong)(pMVar20[1].dims == 3) * 2];
      }
    }
    else {
      if (iVar32 == 0) {
        uVar12 = pMVar20->elempack * (&pMVar20->h)[(ulong)(pMVar20->dims == 3) * 2];
      }
      else {
        uVar12 = pMVar20->w;
      }
LAB_004e5738:
      uVar30 = *(uint *)(&this->field_0xf0 + (long)p_Var1);
    }
  }
  else {
    if (*(int *)((long)&(this->CT_data).cstep + (long)(p_Var1 + 4)) != 0) {
      uVar12 = *(uint *)(&this->field_0xec + (long)p_Var1);
      goto LAB_004e5738;
    }
    if (iVar32 == 0) goto LAB_004e56f5;
    pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar12 = *(uint *)(&this->field_0xec + (long)p_Var1);
    if (*(int *)(&(this->CT_data).field_0x3c + (long)p_Var1) == 0) {
      uVar30 = pMVar20->w;
    }
    else {
      uVar30 = pMVar20->elempack * (&pMVar20->h)[(ulong)(pMVar20->dims == 3) * 2];
    }
  }
  local_1e8.cstep = 0;
  local_1e8.data = (void *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize._0_4_ = 0;
  local_1e8.elemsize._4_4_ = 0;
  local_1e8.elempack = 0;
  local_1e8.allocator = (Allocator *)0x0;
  local_1e8.dims = 0;
  local_1e8.w = 0;
  local_1e8.h = 0;
  local_1e8.d = 0;
  local_1e8.c = 0;
  p_Var1 = this->_vptr_Gemm_x86_avx512[-3];
  local_300 = (pointer)bottom_blobs;
  local_130 = this;
  if (*(int *)(&this->field_0xe8 + (long)p_Var1) == 0) {
    iVar32 = *(int *)((long)&(this->CT_data).cstep + (long)p_Var1);
    local_290 = (Mat *)top_blobs;
    if (iVar32 == 0) {
LAB_004e58ae:
      pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar15 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar20;
      if (*(int *)((long)&(this->CT_data).cstep + (long)(p_Var1 + 4)) == 0) {
        if (lVar15 == 0xd8) {
          local_1e8.data = pMVar20[2].data;
          piVar18 = pMVar20[2].refcount;
          sVar23 = pMVar20[2].elemsize;
          local_1e8.elempack = pMVar20[2].elempack;
          local_1e8.allocator = pMVar20[2].allocator;
          uVar36._0_4_ = pMVar20[2].dims;
          uVar36._4_4_ = pMVar20[2].w;
          uVar40._0_4_ = pMVar20[2].h;
          uVar40._4_4_ = pMVar20[2].d;
          local_1e8.c = pMVar20[2].c;
          local_1e8.cstep = pMVar20[2].cstep;
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + 1;
            UNLOCK();
          }
        }
        else {
          uVar36 = 0;
          uVar40 = 0;
          local_1e8.cstep = 0;
          local_1e8.c = 0;
          local_1e8.allocator = (Allocator *)0x0;
          local_1e8.elempack = 0;
          sVar23 = 0;
          piVar18 = (int *)0x0;
          local_1e8.data = (void *)0x0;
        }
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + 1;
          UNLOCK();
        }
        local_1e8.refcount._0_4_ = SUB84(piVar18,0);
        local_1e8.refcount._4_4_ = (uint)((ulong)piVar18 >> 0x20);
        local_1e8.elemsize._0_4_ = (int)sVar23;
        local_1e8.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
        local_1e8.dims = (int)uVar36;
        local_1e8.w = (int)((ulong)uVar36 >> 0x20);
        local_1e8.h = (int)uVar40;
        local_1e8.d = (int)((ulong)uVar40 >> 0x20);
        local_308 = (Mat *)opt;
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if (local_1e8.allocator == (Allocator *)0x0) goto LAB_004e883f;
            (*(local_1e8.allocator)->_vptr_Allocator[3])(local_1e8.allocator);
          }
        }
      }
      else {
        if (lVar15 == 0x90) {
          local_1e8.data = pMVar20[1].data;
          piVar18 = pMVar20[1].refcount;
          sVar23 = pMVar20[1].elemsize;
          local_1e8.elempack = pMVar20[1].elempack;
          local_1e8.allocator = pMVar20[1].allocator;
          uVar35._0_4_ = pMVar20[1].dims;
          uVar35._4_4_ = pMVar20[1].w;
          uVar39._0_4_ = pMVar20[1].h;
          uVar39._4_4_ = pMVar20[1].d;
          local_1e8.c = pMVar20[1].c;
          local_1e8.cstep = pMVar20[1].cstep;
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + 1;
            UNLOCK();
          }
        }
        else {
          uVar35 = 0;
          uVar39 = 0;
          local_1e8.cstep = 0;
          local_1e8.c = 0;
          local_1e8.allocator = (Allocator *)0x0;
          local_1e8.elempack = 0;
          sVar23 = 0;
          piVar18 = (int *)0x0;
          local_1e8.data = (void *)0x0;
        }
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + 1;
          UNLOCK();
        }
        local_1e8.refcount._0_4_ = SUB84(piVar18,0);
        local_1e8.refcount._4_4_ = (uint)((ulong)piVar18 >> 0x20);
        local_1e8.elemsize._0_4_ = (int)sVar23;
        local_1e8.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
        local_1e8.dims = (int)uVar35;
        local_1e8.w = (int)((ulong)uVar35 >> 0x20);
        local_1e8.h = (int)uVar39;
        local_1e8.d = (int)((ulong)uVar39 >> 0x20);
        local_308 = (Mat *)opt;
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if (local_1e8.allocator == (Allocator *)0x0) {
LAB_004e883f:
              local_308 = (Mat *)opt;
              if (local_1e8.data != (void *)0x0) {
                free(local_1e8.data);
              }
            }
            else {
              (*(local_1e8.allocator)->_vptr_Allocator[3])(local_1e8.allocator);
            }
          }
        }
      }
    }
    else if (*(int *)((long)&(this->CT_data).cstep + (long)(p_Var1 + 4)) == 0) {
      if (iVar32 == 0) goto LAB_004e58ae;
      pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar20 == 0x90) {
        local_1e8.data = pMVar20[1].data;
        piVar18 = pMVar20[1].refcount;
        sVar23 = pMVar20[1].elemsize;
        local_1e8.elempack = pMVar20[1].elempack;
        local_1e8.allocator = pMVar20[1].allocator;
        uVar37._0_4_ = pMVar20[1].dims;
        uVar37._4_4_ = pMVar20[1].w;
        uVar41._0_4_ = pMVar20[1].h;
        uVar41._4_4_ = pMVar20[1].d;
        local_1e8.c = pMVar20[1].c;
        local_1e8.cstep = pMVar20[1].cstep;
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + 1;
          UNLOCK();
        }
      }
      else {
        uVar37 = 0;
        uVar41 = 0;
        local_1e8.cstep = 0;
        local_1e8.c = 0;
        local_1e8.allocator = (Allocator *)0x0;
        local_1e8.elempack = 0;
        sVar23 = 0;
        piVar18 = (int *)0x0;
        local_1e8.data = (void *)0x0;
      }
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + 1;
        UNLOCK();
      }
      local_1e8.refcount._0_4_ = SUB84(piVar18,0);
      local_1e8.refcount._4_4_ = (uint)((ulong)piVar18 >> 0x20);
      local_1e8.elemsize._0_4_ = (int)sVar23;
      local_1e8.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
      local_1e8.dims = (int)uVar37;
      local_1e8.w = (int)((ulong)uVar37 >> 0x20);
      local_1e8.h = (int)uVar41;
      local_1e8.d = (int)((ulong)uVar41 >> 0x20);
      local_308 = (Mat *)opt;
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) goto LAB_004e883f;
          (*(local_1e8.allocator)->_vptr_Allocator[3])(local_1e8.allocator);
        }
      }
    }
    else {
      pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar20 == 0x48) {
        local_1e8.data = pMVar20->data;
        piVar18 = pMVar20->refcount;
        sVar23 = pMVar20->elemsize;
        local_1e8.elempack = pMVar20->elempack;
        local_2b8 = pMVar20->allocator;
        uVar34._0_4_ = pMVar20->dims;
        uVar34._4_4_ = pMVar20->w;
        uVar38._0_4_ = pMVar20->h;
        uVar38._4_4_ = pMVar20->d;
        local_1e8.c = pMVar20->c;
        local_1e8.cstep = pMVar20->cstep;
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + 1;
          UNLOCK();
        }
      }
      else {
        uVar34 = 0;
        uVar38 = 0;
        local_2b8 = (Allocator *)0x0;
        local_1e8.elempack = 0;
        sVar23 = 0;
        piVar18 = (int *)0x0;
        local_1e8.data = (void *)0x0;
        local_1e8.c = 0;
        local_1e8.cstep = 0;
      }
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + 1;
        UNLOCK();
      }
      local_1e8.refcount._0_4_ = SUB84(piVar18,0);
      local_1e8.refcount._4_4_ = (uint)((ulong)piVar18 >> 0x20);
      local_1e8.elemsize._0_4_ = (int)sVar23;
      local_1e8.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
      local_1e8.allocator = local_2b8;
      local_1e8.dims = (int)uVar34;
      local_1e8.w = (int)((ulong)uVar34 >> 0x20);
      local_1e8.h = (int)uVar38;
      local_1e8.d = (int)((ulong)uVar38 >> 0x20);
      local_308 = (Mat *)opt;
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if (local_2b8 == (Allocator *)0x0) goto LAB_004e883f;
          (*local_2b8->_vptr_Allocator[3])();
        }
      }
    }
    this = local_130;
    top_blobs = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_290;
    pAVar27 = local_2b8;
    local_2b8 = (Allocator *)((ulong)local_2b8 & 0xffffffff00000000);
    if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0)) {
      uVar25 = 4;
      if (local_1e8.elempack * local_1e8.w != uVar30) {
        uVar25 = (uint)(local_1e8.elempack * local_1e8.w == uVar12 && local_1e8.dims == 1);
      }
      uVar31 = 0;
      if (local_1e8.dims == 1) {
        uVar31 = uVar25;
      }
      uVar25 = local_1e8.dims ^ 2;
      if ((local_1e8.w == 1 && uVar25 == 0) && (local_1e8.elempack * local_1e8.h == uVar12)) {
        uVar31 = 2;
      }
      local_2b8._4_4_ = SUB84(pAVar27,4);
      if ((uVar25 == 0 && local_1e8.w == uVar30) && (local_1e8.elempack * local_1e8.h == uVar12)) {
        uVar31 = 3;
      }
      if ((uVar25 == 0 && local_1e8.w == uVar30) && (local_1e8.elempack * local_1e8.h == 1)) {
        uVar31 = 4;
      }
      local_2b8 = (Allocator *)CONCAT44(local_2b8._4_4_,uVar31);
      if (*(float *)((long)&(local_130->CT_data).d + (long)local_130->_vptr_Gemm_x86_avx512[-3]) !=
          1.0) {
        local_188.cstep = 0;
        local_188.data = (void *)0x0;
        local_188.refcount._0_4_ = 0;
        local_188.refcount._4_4_ = 0;
        local_188.elemsize._0_4_ = 0;
        local_188.elemsize._4_4_ = 0;
        local_188.elempack = 0;
        local_188.allocator = (Allocator *)0x0;
        local_188.dims = 0;
        local_188.d = 0;
        local_188.c = 0;
        local_188.w = local_188.refcount._4_4_;
        local_188.h = (int)local_188.elemsize;
        Mat::create_like(&local_188,&local_1e8,opt->workspace_allocator);
        uVar25 = local_1e8.c * (int)local_1e8.cstep * local_1e8.elempack;
        if (0 < (int)uVar25) {
          pp_Var2 = this->_vptr_Gemm_x86_avx512;
          uVar21 = 0;
          do {
            *(float *)((long)local_188.data + uVar21 * 4) =
                 *(float *)((long)&(this->CT_data).d + (long)pp_Var2[-3]) *
                 *(float *)((long)local_1e8.data + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar25 != uVar21);
        }
        piVar18 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + 1;
          UNLOCK();
        }
        piVar18 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if (local_1e8.allocator == (Allocator *)0x0) {
              if (local_1e8.data != (void *)0x0) {
                free(local_1e8.data);
              }
            }
            else {
              (*(local_1e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar18 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        local_1e8.data = local_188.data;
        local_1e8.refcount._0_4_ = local_188.refcount._0_4_;
        local_1e8.refcount._4_4_ = local_188.refcount._4_4_;
        local_1e8.elemsize._0_4_ = (int)local_188.elemsize;
        local_1e8.elemsize._4_4_ = local_188.elemsize._4_4_;
        local_1e8.elempack = local_188.elempack;
        local_1e8.allocator = local_188.allocator;
        local_1e8.dims = local_188.dims;
        local_1e8.w = local_188.w;
        local_1e8.h = local_188.h;
        local_1e8.d = local_188.d;
        local_1e8.c = local_188.c;
        local_1e8.cstep = local_188.cstep;
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              if (local_188.data != (void *)0x0) {
                free(local_188.data);
              }
            }
            else {
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_188.cstep = 0;
        local_188.data = (void *)0x0;
        local_188.refcount._0_4_ = 0;
        local_188.refcount._4_4_ = 0;
        local_188.elemsize._0_4_ = 0;
        local_188.elemsize._4_4_ = 0;
        local_188.elempack = 0;
        local_188.dims = 0;
        local_188.w = 0;
        local_188.h = 0;
        local_188.d = 0;
        local_188.c = 0;
      }
    }
  }
  else {
    if (&local_1e8 != &this->CT_data) {
      piVar18 = (this->CT_data).refcount;
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + 1;
        UNLOCK();
      }
      local_1e8.data = (this->CT_data).data;
      piVar18 = (this->CT_data).refcount;
      local_1e8.refcount._0_4_ = SUB84(piVar18,0);
      local_1e8.refcount._4_4_ = (uint)((ulong)piVar18 >> 0x20);
      sVar23 = (this->CT_data).elemsize;
      local_1e8.elemsize._0_4_ = (int)sVar23;
      local_1e8.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
      local_1e8.elempack = (this->CT_data).elempack;
      local_1e8.allocator = (this->CT_data).allocator;
      uVar3 = (this->CT_data).dims;
      uVar4 = (this->CT_data).w;
      uVar5 = (this->CT_data).h;
      uVar6 = (this->CT_data).d;
      local_1e8.c = (this->CT_data).c;
      local_1e8.cstep = (this->CT_data).cstep;
      local_1e8.dims = uVar3;
      local_1e8.w = uVar4;
      local_1e8.h = uVar5;
      local_1e8.d = uVar6;
    }
    local_2b8 = (Allocator *)
                CONCAT44(local_2b8._4_4_,
                         *(undefined4 *)(&this->field_0xf8 + (long)this->_vptr_Gemm_x86_avx512[-3]))
    ;
  }
  uVar25 = 1;
  if (opt->use_packing_layout == true) {
    uVar25 = uVar30;
    if (*(int *)(&this->field_0x108 + (long)this->_vptr_Gemm_x86_avx512[-3]) == 0) {
      uVar25 = uVar12;
    }
    if ((uVar25 & 0xf) == 0) {
      uVar25 = 0x10;
    }
    else if ((uVar25 & 7) == 0) {
      uVar25 = 8;
    }
    else {
      uVar25 = (uint)((uVar25 & 3) == 0) * 3 + 1;
    }
  }
  p_Var1 = this->_vptr_Gemm_x86_avx512[-3];
  if (*(uint *)(&this->field_0x100 + (long)p_Var1) != 0) {
    uVar25 = *(uint *)(&this->field_0x100 + (long)p_Var1);
  }
  local_38 = (ulong)uVar25;
  pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar31 = uVar30;
  if (*(int *)(&this->field_0x108 + (long)p_Var1) != 0) {
    uVar31 = uVar12;
    uVar12 = uVar30;
  }
  local_290 = pMVar26;
  if (*(int *)(&this->field_0xfc + (long)p_Var1) == 0) {
    Mat::create(pMVar26,uVar31,(int)uVar12 / (int)uVar25,(ulong)(uVar25 * 4),uVar25,
                opt->blob_allocator);
  }
  else {
    Mat::create(pMVar26,uVar31,1,(int)uVar12 / (int)uVar25,(ulong)(uVar25 * 4),uVar25,
                opt->blob_allocator);
  }
  iVar32 = -100;
  if ((pMVar26->data == (void *)0x0) || ((long)pMVar26->c * pMVar26->cstep == 0)) goto LAB_004e86ed;
  uVar12 = this->nT;
  uVar30 = uVar12;
  if (uVar12 == 0) {
    uVar30 = opt->num_threads;
  }
  if (opt->num_threads != uVar12 && uVar12 != 0) {
    forward();
  }
  p_Var1 = this->_vptr_Gemm_x86_avx512[-3];
  iVar32 = *(int *)((long)&(this->CT_data).cstep + (long)p_Var1);
  if (iVar32 == 0) {
LAB_004e6494:
    local_2d8 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_300->data)->_M_impl)
                .super__Vector_impl_data._M_start;
    if (*(int *)((long)&(this->CT_data).cstep + (long)(p_Var1 + 4)) == 0) {
      iVar32 = *(int *)((long)&(this->CT_data).c + (long)p_Var1);
      local_2e8 = CONCAT44(local_2e8._4_4_,iVar32);
      if (iVar32 == 0) {
        iVar17 = local_2d8->elempack * (&local_2d8->h)[(ulong)(local_2d8->dims == 3) * 2];
      }
      else {
        iVar17 = local_2d8->w;
      }
      iVar10 = *(int *)(&(this->CT_data).field_0x3c + (long)p_Var1);
      local_2c8 = (Allocator *)CONCAT44(local_2c8._4_4_,iVar10);
      if (iVar32 == 0) {
        uVar12 = local_2d8->w;
      }
      else {
        uVar12 = local_2d8->elempack * (&local_2d8->h)[(ulong)(local_2d8->dims == 3) * 2];
      }
      local_300 = (pointer)(ulong)uVar12;
      if (iVar10 == 0) {
        uVar25 = local_2d8[1].w;
      }
      else {
        uVar25 = local_2d8[1].elempack * (&local_2d8[1].h)[(ulong)(local_2d8[1].dims == 3) * 2];
      }
      local_298 = CONCAT44(local_298._4_4_,*(undefined4 *)(&this->field_0x108 + (long)p_Var1));
      local_308 = (Mat *)opt;
      get_optimal_tile_mnk
                (iVar17,uVar25,uVar12,*(int *)(&this->field_0x10c + (long)p_Var1),
                 *(int *)(&this->field_0x110 + (long)p_Var1),
                 *(int *)(&this->field_0x114 + (long)p_Var1),&TILE_K,&TILE_K_1,&TILE_K_3,uVar30);
      iVar10 = TILE_K_3;
      iVar32 = TILE_K_1;
      local_2cc = (iVar17 + TILE_K + -1) / TILE_K;
      iVar9 = (int)(TILE_K_3 + uVar12 + -1) / TILE_K_3;
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      Mat::create(&local_188,TILE_K * TILE_K_3,iVar9,uVar30,4,opt->workspace_allocator);
      iVar13 = (int)(iVar32 + uVar25 + -1) / iVar32;
      local_238.cstep = 0;
      local_238.data = (void *)0x0;
      local_238.refcount._0_4_ = 0;
      local_238.refcount._4_4_ = 0;
      local_238.elemsize._0_4_ = 0;
      local_238.elemsize._4_4_ = 0;
      local_238.elempack = 0;
      local_238.allocator = (Allocator *)0x0;
      local_238.dims = 0;
      local_238.w = 0;
      local_238.h = 0;
      local_238.d = 0;
      local_238.c = 0;
      local_2a0 = (Allocator *)(ulong)uVar30;
      local_240 = (ulong)uVar25;
      Mat::create(&local_238,iVar10 * iVar32,iVar9,iVar13,4,opt->workspace_allocator);
      iVar17 = TILE_K_3;
      iVar32 = TILE_K_1;
      local_2f8 = (Mat *)CONCAT44(local_2f8._4_4_,iVar9);
      iVar13 = iVar13 * iVar9;
      if (0 < iVar13) {
        pMVar26 = local_2d8 + 1;
        iVar10 = 0;
        do {
          iVar14 = iVar32 * (iVar10 / (int)local_2f8);
          iVar16 = iVar17 * (int)((long)iVar10 % (long)(int)local_2f8);
          iVar9 = (int)local_240 - iVar14;
          if (iVar32 < iVar9) {
            iVar9 = iVar32;
          }
          iVar22 = (int)local_300 - iVar16;
          if (iVar17 < iVar22) {
            iVar22 = iVar17;
          }
          local_288.cstep = (size_t)local_238.w;
          local_288.data =
               (void *)((long)local_238.data +
                       ((long)iVar10 % (long)(int)local_2f8 & 0xffffffffU) * local_288.cstep *
                       CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) +
                       (long)(iVar10 / (int)local_2f8) * local_238.cstep *
                       CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize));
          local_288.refcount._0_4_ = 0;
          local_288.refcount._4_4_ = 0;
          local_288.elemsize._0_4_ = (undefined4)local_238.elemsize;
          local_288.elemsize._4_4_ = local_238.elemsize._4_4_;
          local_288.elempack = local_238.elempack;
          local_288.allocator = local_238.allocator;
          local_288.dims = 2;
          local_288.w = local_238.w;
          local_288.h = 1;
          local_288.d = 1;
          local_288.c = 1;
          if ((int)local_2c8 == 0) {
            transpose_pack_B_tile(pMVar26,&local_288,iVar14,iVar9,iVar16,iVar22);
          }
          else {
            pack_B_tile(pMVar26,&local_288,iVar14,iVar9,iVar16,iVar22);
          }
          iVar10 = iVar10 + 1;
        } while (iVar13 != iVar10);
      }
      local_288.cstep = 0;
      local_288.data = (void *)0x0;
      local_288.refcount._0_4_ = 0;
      local_288.refcount._4_4_ = 0;
      local_288.elemsize._0_4_ = 0;
      local_288.elemsize._4_4_ = 0;
      local_288.elempack = 0;
      local_288.allocator = (Allocator *)0x0;
      local_288.dims = 0;
      local_288.w = 0;
      local_288.h = 0;
      local_288.d = 0;
      local_288.c = 0;
      iVar32 = (int)local_2b8;
      if ((((int)local_298 != 0) || ((int)local_2b8 == 3)) || (TILE_K_3 < (int)local_300)) {
        Mat::create(&local_288,TILE_K * TILE_K_1,1,(int)local_2a0,4,(Allocator *)local_308->elemsize
                   );
      }
      pMVar26 = local_290;
      if (0 < local_2cc) {
        local_2f8 = (Mat *)CONCAT71(local_2f8._1_7_,(int)local_298 == 0);
        iVar17 = 0;
        uVar21 = local_240;
        do {
          if ((int)local_2e8 == 0) {
            iVar10 = local_2d8->elempack * (&local_2d8->h)[(ulong)(local_2d8->dims == 3) * 2];
            iVar9 = local_2d8->w;
          }
          else {
            iVar10 = local_2d8->w;
            iVar9 = local_2d8->elempack * (&local_2d8->h)[(ulong)(local_2d8->dims == 3) * 2];
          }
          local_2c8 = (Allocator *)(ulong)(uint)(TILE_K * iVar17);
          uVar12 = iVar10 - TILE_K * iVar17;
          if (TILE_K < (int)uVar12) {
            uVar12 = TILE_K;
          }
          local_300 = (pointer)(ulong)uVar12;
          local_128.cstep = 0;
          local_128.data = (void *)0x0;
          local_128.refcount._0_4_ = 0;
          local_128.refcount._4_4_ = 0;
          local_128.elemsize._0_4_ = 0;
          local_128.elemsize._4_4_ = 0;
          local_128.elempack = 0;
          local_128.h = 0;
          local_128.d = 0;
          local_128.c = 0;
          local_128.allocator = (Allocator *)0x0;
          local_128.dims = 0;
          local_128.w = 0;
          local_2dc = iVar17;
          if ((((int)local_298 != 0) || (iVar32 == 3)) || (TILE_K_3 < iVar9)) {
            iVar10 = get_omp_thread_num();
            iVar17 = local_288.h;
            iVar32 = local_288.dims;
            uVar8 = local_288.elemsize._4_4_;
            uVar7 = (undefined4)local_288.elemsize;
            uVar28 = (ulong)local_288.w;
            uVar21 = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
            pvVar33 = (void *)((long)iVar10 * local_288.cstep * uVar21 + (long)local_288.data);
            uVar11 = uVar21 * (long)local_288.h * uVar28 + 0xf & 0xfffffffffffffff0;
            uVar19 = uVar11 / uVar21;
            if (local_288.dims == 4) {
              uVar19 = (long)local_288.h * uVar28;
            }
            piVar18 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
            pAVar27 = local_288.allocator;
            iVar10 = local_288.elempack;
            iVar13 = local_288.w;
            iVar14 = local_288.d;
            if (piVar18 != (int *)0x0) {
              LOCK();
              *piVar18 = *piVar18 + -1;
              UNLOCK();
              if (*piVar18 == 0) {
                if (local_128.allocator == (Allocator *)0x0) {
                  if (local_128.data != (void *)0x0) {
                    local_308 = (Mat *)CONCAT44(local_308._4_4_,local_288.d);
                    local_198 = CONCAT44(local_198._4_4_,local_288.elempack);
                    local_2a0 = local_288.allocator;
                    local_138 = uVar28;
                    free(local_128.data);
                    iVar13 = (int)local_138;
                    pAVar27 = local_2a0;
                    iVar10 = (int)local_198;
                    iVar14 = (int)local_308;
                  }
                }
                else {
                  local_308 = (Mat *)CONCAT44(local_308._4_4_,local_288.d);
                  local_198 = CONCAT44(local_198._4_4_,local_288.elempack);
                  local_2a0 = local_288.allocator;
                  local_138 = uVar28;
                  (*(local_128.allocator)->_vptr_Allocator[3])
                            (local_128.allocator,local_128.data,uVar11 % uVar21);
                  pAVar27 = local_2a0;
                  iVar10 = (int)local_198;
                  iVar13 = (int)local_138;
                  iVar14 = (int)local_308;
                }
              }
            }
            local_128.dims = iVar32 + -1;
            local_128.elemsize._0_4_ = uVar7;
            local_128.elemsize._4_4_ = uVar8;
            local_128.h = iVar17;
            local_128.d = 1;
            pMVar26 = local_290;
            uVar21 = local_240;
            local_128.data = pvVar33;
            local_128.elempack = iVar10;
            local_128.allocator = pAVar27;
            local_128.w = iVar13;
            local_128.c = iVar14;
            local_128.cstep = uVar19;
          }
          local_128.refcount._4_4_ = 0;
          local_128.refcount._0_4_ = 0;
          if (0 < (int)uVar21) {
            iVar32 = 0;
            do {
              iVar17 = (int)uVar21 - iVar32;
              if (TILE_K_1 < iVar17) {
                iVar17 = TILE_K_1;
              }
              local_308 = &local_1e8;
              if ((int)local_2b8 == 3) {
                pack_A_tile(&local_1e8,&local_128,(int)local_2c8,(int)local_300,iVar32,iVar17);
                local_308 = &local_128;
              }
              if (0 < iVar9) {
                iVar10 = 0;
                do {
                  iVar14 = TILE_K_3;
                  iVar13 = iVar9 - iVar10;
                  if (TILE_K_3 < iVar9 - iVar10) {
                    iVar13 = TILE_K_3;
                  }
                  iVar16 = get_omp_thread_num();
                  local_98 = (size_t)local_188.w;
                  lVar15 = (long)(iVar10 / iVar14);
                  _TILE_M = (void *)((long)local_188.data +
                                    CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize) *
                                    local_98 * lVar15 +
                                    (long)iVar16 * local_188.cstep *
                                    CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize));
                  local_48 = (size_t)local_238.w;
                  _TILE_N = (void *)((long)local_238.data +
                                    local_48 *
                                    CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize
                                            ) * lVar15 +
                                    (long)(iVar32 / TILE_K_1) * local_238.cstep *
                                    CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize
                                            ));
                  uStack_d0 = 0;
                  uStack_cc = 0;
                  local_c8 = (int)local_188.elemsize;
                  uStack_c4 = local_188.elemsize._4_4_;
                  local_c0 = local_188.elempack;
                  local_b8 = local_188.allocator;
                  local_b0._4_4_ = local_188.w;
                  local_b0._0_4_ = 2;
                  uStack_a8._0_4_ = 1;
                  uStack_a8._4_4_ = 1;
                  local_a0 = 1;
                  uStack_80 = 0;
                  uStack_7c = 0;
                  local_78 = (undefined4)local_238.elemsize;
                  uStack_74 = local_238.elemsize._4_4_;
                  local_70 = local_238.elempack;
                  local_68 = local_238.allocator;
                  local_60._4_4_ = local_238.w;
                  local_60._0_4_ = 2;
                  uStack_58._0_4_ = 1;
                  uStack_58._4_4_ = 1;
                  local_50 = 1;
                  if (iVar32 == 0) {
                    if ((int)local_2e8 == 0) {
                      pack_A_tile(local_2d8,(Mat *)&TILE_M,(int)local_2c8,(int)local_300,iVar10,
                                  iVar13);
                    }
                    else {
                      transpose_pack_A_tile
                                (local_2d8,(Mat *)&TILE_M,(int)local_2c8,(int)local_300,iVar10,
                                 iVar13);
                    }
                  }
                  pMVar26 = local_290;
                  gemm_transB_packed_tile
                            ((Mat *)&TILE_M,(Mat *)&TILE_N,local_308,&local_128,local_290,
                             (int)local_2b8,(int)local_2c8,(int)local_300,iVar32,iVar17,iVar10,
                             iVar13,(bool)(iVar9 <= iVar14 + iVar10 & (byte)local_2f8));
                  local_48 = 0;
                  _TILE_N = (void *)0x0;
                  uStack_80 = 0;
                  uStack_7c = 0;
                  local_78 = 0;
                  uStack_74 = 0;
                  local_70 = 0;
                  local_60._0_4_ = 0;
                  local_60._4_4_ = 0;
                  uStack_58._0_4_ = 0;
                  uStack_58._4_4_ = 0;
                  local_50 = 0;
                  piVar18 = (int *)CONCAT44(uStack_cc,uStack_d0);
                  if (piVar18 != (int *)0x0) {
                    LOCK();
                    *piVar18 = *piVar18 + -1;
                    UNLOCK();
                    if (*piVar18 == 0) {
                      if (local_b8 == (Allocator *)0x0) {
                        if (_TILE_M != (void *)0x0) {
                          free(_TILE_M);
                        }
                      }
                      else {
                        (*local_b8->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_98 = 0;
                  _TILE_M = (void *)0x0;
                  uStack_d0 = 0;
                  uStack_cc = 0;
                  local_c8 = 0;
                  uStack_c4 = 0;
                  local_c0 = 0;
                  local_b0._0_4_ = 0;
                  local_b0._4_4_ = 0;
                  uStack_a8._0_4_ = 0;
                  uStack_a8._4_4_ = 0;
                  local_a0 = 0;
                  iVar10 = iVar10 + TILE_K_3;
                } while (iVar10 < iVar9);
              }
              if ((int)local_298 != 0) {
                transpose_unpack_output_tile
                          (&local_128,pMVar26,(int)local_2c8,(int)local_300,iVar32,iVar17);
              }
              iVar32 = iVar32 + TILE_K_1;
              uVar21 = local_240;
            } while (iVar32 < (int)local_240);
          }
          iVar17 = local_2dc;
          piVar18 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
          iVar32 = (int)local_2b8;
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + -1;
            UNLOCK();
            if (*piVar18 == 0) {
              if (local_128.allocator == (Allocator *)0x0) {
                if (local_128.data != (void *)0x0) {
                  free(local_128.data);
                }
              }
              else {
                (*(local_128.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_128.cstep = 0;
          local_128.data = (void *)0x0;
          local_128.refcount._0_4_ = 0;
          local_128.refcount._4_4_ = 0;
          local_128.elemsize._0_4_ = 0;
          local_128.elemsize._4_4_ = 0;
          local_128.elempack = 0;
          local_128.dims = 0;
          local_128.w = 0;
          local_128.h = 0;
          local_128.d = 0;
          local_128.c = 0;
          iVar17 = iVar17 + 1;
        } while (iVar17 != local_2cc);
      }
      this = local_130;
      piVar18 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if (local_288.allocator == (Allocator *)0x0) {
            if (local_288.data != (void *)0x0) {
              free(local_288.data);
            }
          }
          else {
            (*(local_288.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_288.cstep = 0;
      local_288.data = (void *)0x0;
      local_288.refcount._0_4_ = 0;
      local_288.refcount._4_4_ = 0;
      local_288.elemsize._0_4_ = 0;
      local_288.elemsize._4_4_ = 0;
      local_288.elempack = 0;
      local_288.dims = 0;
      local_288.w = 0;
      local_288.h = 0;
      local_288.d = 0;
      local_288.c = 0;
      piVar18 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if (local_238.allocator == (Allocator *)0x0) {
            if (local_238.data != (void *)0x0) {
              free(local_238.data);
            }
          }
          else {
            (*(local_238.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_238.cstep = 0;
      local_238.data = (void *)0x0;
      local_238.refcount._0_4_ = 0;
      local_238.refcount._4_4_ = 0;
      local_238.elemsize._0_4_ = 0;
      local_238.elemsize._4_4_ = 0;
      local_238.elempack = 0;
      local_238.dims = 0;
      local_238.w = 0;
      local_238.h = 0;
      local_238.d = 0;
      local_238.c = 0;
      piVar18 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if (local_188.allocator == (Allocator *)0x0) goto joined_r0x004e84da;
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      iVar32 = *(int *)((long)&(this->CT_data).c + (long)p_Var1);
      local_2dc = *(int *)(&this->field_0xf0 + (long)p_Var1);
      iVar17 = *(int *)(&this->field_0xf4 + (long)p_Var1);
      local_240 = CONCAT44(local_240._4_4_,iVar32);
      if (iVar32 == 0) {
        iVar32 = local_2d8->elempack * (&local_2d8->h)[(ulong)(local_2d8->dims == 3) * 2];
      }
      else {
        iVar32 = local_2d8->w;
      }
      local_298 = CONCAT44(local_298._4_4_,*(undefined4 *)(&this->field_0x108 + (long)p_Var1));
      local_308 = (Mat *)opt;
      get_optimal_tile_mnk
                (iVar32,local_2dc,iVar17,*(int *)(&this->field_0x10c + (long)p_Var1),
                 *(int *)(&this->field_0x110 + (long)p_Var1),
                 *(int *)(&this->field_0x114 + (long)p_Var1),&TILE_N,&TILE_K,&TILE_K_1,uVar30);
      iVar10 = TILE_K_1;
      iVar9 = TILE_N;
      local_138 = CONCAT44(local_138._4_4_,(iVar32 + TILE_N + -1) / TILE_N);
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      Mat::create(&local_188,TILE_K_1 * TILE_N,(iVar17 + TILE_K_1 + -1) / TILE_K_1,uVar30,4,
                  (Allocator *)local_308->elemsize);
      local_238.cstep = 0;
      local_238.data = (void *)0x0;
      local_238.refcount._0_4_ = 0;
      local_238.refcount._4_4_ = 0;
      local_238.elemsize._0_4_ = 0;
      local_238.elemsize._4_4_ = 0;
      local_238.elempack = 0;
      local_238.allocator = (Allocator *)0x0;
      local_238.dims = 0;
      local_238.w = 0;
      local_238.h = 0;
      local_238.d = 0;
      local_238.c = 0;
      if ((((int)local_298 != 0) || ((int)local_2b8 == 3)) || (iVar10 < iVar17)) {
        Mat::create(&local_238,iVar9 * TILE_K,1,uVar30,4,(Allocator *)local_308->elemsize);
      }
      if (0 < (int)local_138) {
        local_2e8 = CONCAT71(local_2e8._1_7_,(int)local_298 == 0);
        local_2cc = 0;
        iVar32 = local_2dc;
        do {
          if ((int)local_240 == 0) {
            iVar17 = local_2d8->elempack * (&local_2d8->h)[(ulong)(local_2d8->dims == 3) * 2];
          }
          else {
            iVar17 = local_2d8->w;
          }
          if ((int)local_240 == 0) {
            iVar10 = local_2d8->w;
          }
          else {
            iVar10 = local_2d8->elempack * (&local_2d8->h)[(ulong)(local_2d8->dims == 3) * 2];
          }
          local_2c8 = (Allocator *)(ulong)(uint)(TILE_N * local_2cc);
          uVar12 = iVar17 - TILE_N * local_2cc;
          if (TILE_N < (int)uVar12) {
            uVar12 = TILE_N;
          }
          local_300 = (pointer)(ulong)uVar12;
          local_288.cstep = 0;
          local_288.data = (void *)0x0;
          local_288.refcount._0_4_ = 0;
          local_288.refcount._4_4_ = 0;
          local_288.elemsize._0_4_ = 0;
          local_288.elemsize._4_4_ = 0;
          local_288.elempack = 0;
          local_288.h = 0;
          local_288.d = 0;
          local_288.c = 0;
          local_288.allocator = (Allocator *)0x0;
          local_288.dims = 0;
          local_288.w = 0;
          if ((((int)local_298 != 0) || ((int)local_2b8 == 3)) || (TILE_K_1 < iVar10)) {
            iVar9 = get_omp_thread_num();
            iVar17 = local_238.h;
            iVar32 = local_238.dims;
            uVar8 = local_238.elemsize._4_4_;
            uVar7 = (undefined4)local_238.elemsize;
            pMVar26 = (Mat *)(long)local_238.w;
            uVar21 = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
            pvVar33 = (void *)((long)iVar9 * local_238.cstep * uVar21 + (long)local_238.data);
            uVar11 = uVar21 * (long)local_238.h * (long)pMVar26 + 0xf & 0xfffffffffffffff0;
            uVar19 = uVar11 / uVar21;
            if (local_238.dims == 4) {
              uVar19 = (long)local_238.h * (long)pMVar26;
            }
            piVar18 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
            pAVar27 = local_238.allocator;
            iVar9 = local_238.elempack;
            iVar13 = local_238.w;
            iVar14 = local_238.d;
            if (piVar18 != (int *)0x0) {
              LOCK();
              *piVar18 = *piVar18 + -1;
              UNLOCK();
              if (*piVar18 == 0) {
                if (local_288.allocator == (Allocator *)0x0) {
                  if (local_288.data != (void *)0x0) {
                    local_308 = (Mat *)CONCAT44(local_308._4_4_,local_238.d);
                    local_198 = CONCAT44(local_198._4_4_,local_238.elempack);
                    local_2a0 = local_238.allocator;
                    local_2f8 = pMVar26;
                    free(local_288.data);
                    iVar13 = (int)local_2f8;
                    pAVar27 = local_2a0;
                    iVar9 = (int)local_198;
                    iVar14 = (int)local_308;
                  }
                }
                else {
                  local_308 = (Mat *)CONCAT44(local_308._4_4_,local_238.d);
                  local_198 = CONCAT44(local_198._4_4_,local_238.elempack);
                  local_2a0 = local_238.allocator;
                  local_2f8 = pMVar26;
                  (*(local_288.allocator)->_vptr_Allocator[3])
                            (local_288.allocator,local_288.data,uVar11 % uVar21);
                  pAVar27 = local_2a0;
                  iVar9 = (int)local_198;
                  iVar13 = (int)local_2f8;
                  iVar14 = (int)local_308;
                }
              }
            }
            local_288.dims = iVar32 + -1;
            local_288.elemsize._0_4_ = uVar7;
            local_288.elemsize._4_4_ = uVar8;
            local_288.h = iVar17;
            local_288.d = 1;
            pMVar26 = local_290;
            iVar32 = local_2dc;
            local_288.data = pvVar33;
            local_288.elempack = iVar9;
            local_288.allocator = pAVar27;
            local_288.w = iVar13;
            local_288.c = iVar14;
            local_288.cstep = uVar19;
          }
          local_288.refcount._4_4_ = 0;
          local_288.refcount._0_4_ = 0;
          if (0 < iVar32) {
            iVar17 = 0;
            do {
              uVar12 = iVar32 - iVar17;
              if (TILE_K < iVar32 - iVar17) {
                uVar12 = TILE_K;
              }
              local_308 = (Mat *)(ulong)uVar12;
              local_2f8 = &local_1e8;
              if ((int)local_2b8 == 3) {
                pack_A_tile(&local_1e8,&local_288,(int)local_2c8,(int)local_300,iVar17,uVar12);
                local_2f8 = &local_288;
              }
              if (0 < iVar10) {
                iVar32 = 0;
                do {
                  iVar13 = TILE_K_1;
                  iVar9 = iVar10 - iVar32;
                  if (TILE_K_1 < iVar10 - iVar32) {
                    iVar9 = TILE_K_1;
                  }
                  iVar14 = get_omp_thread_num();
                  local_128.cstep = (size_t)local_188.w;
                  lVar15 = (long)(iVar32 / iVar13);
                  local_128.data =
                       (void *)((long)local_188.data +
                               CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize) *
                               local_128.cstep * lVar15 +
                               (long)iVar14 * local_188.cstep *
                               CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize));
                  local_128.refcount._0_4_ = 0;
                  local_128.refcount._4_4_ = 0;
                  local_128.elemsize._0_4_ = (int)local_188.elemsize;
                  local_128.elemsize._4_4_ = local_188.elemsize._4_4_;
                  local_128.elempack = local_188.elempack;
                  local_128.allocator = local_188.allocator;
                  local_128.dims = 2;
                  local_128.w = local_188.w;
                  local_128.h = 1;
                  local_128.d = 1;
                  local_128.c = 1;
                  local_b0._4_4_ = (local_130->BT_data).w;
                  local_98 = (size_t)local_b0._4_4_;
                  sVar23 = (local_130->BT_data).elemsize;
                  _TILE_M = (void *)((long)(local_130->BT_data).data +
                                    local_98 * sVar23 * lVar15 +
                                    (long)(iVar17 / TILE_K) * (local_130->BT_data).cstep * sVar23);
                  local_c0 = (local_130->BT_data).elempack;
                  local_b8 = (local_130->BT_data).allocator;
                  uStack_d0 = 0;
                  uStack_cc = 0;
                  local_c8 = (undefined4)sVar23;
                  uStack_c4 = (undefined4)(sVar23 >> 0x20);
                  local_b0._0_4_ = 2;
                  uStack_a8._0_4_ = 1;
                  uStack_a8._4_4_ = 1;
                  local_a0 = 1;
                  if (iVar17 == 0) {
                    if ((int)local_240 == 0) {
                      pack_A_tile(local_2d8,&local_128,(int)local_2c8,(int)local_300,iVar32,iVar9);
                    }
                    else {
                      transpose_pack_A_tile
                                (local_2d8,&local_128,(int)local_2c8,(int)local_300,iVar32,iVar9);
                    }
                  }
                  pMVar26 = local_290;
                  gemm_transB_packed_tile
                            (&local_128,(Mat *)&TILE_M,local_2f8,&local_288,local_290,(int)local_2b8
                             ,(int)local_2c8,(int)local_300,iVar17,(int)local_308,iVar32,iVar9,
                             (bool)(iVar10 <= iVar13 + iVar32 & (byte)local_2e8));
                  local_98 = 0;
                  _TILE_M = (void *)0x0;
                  uStack_d0 = 0;
                  uStack_cc = 0;
                  local_c8 = 0;
                  uStack_c4 = 0;
                  local_c0 = 0;
                  local_b0._0_4_ = 0;
                  local_b0._4_4_ = 0;
                  uStack_a8._0_4_ = 0;
                  uStack_a8._4_4_ = 0;
                  local_a0 = 0;
                  piVar18 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
                  if (piVar18 != (int *)0x0) {
                    LOCK();
                    *piVar18 = *piVar18 + -1;
                    UNLOCK();
                    if (*piVar18 == 0) {
                      if (local_128.allocator == (Allocator *)0x0) {
                        if (local_128.data != (void *)0x0) {
                          free(local_128.data);
                        }
                      }
                      else {
                        (*(local_128.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_128.cstep = 0;
                  local_128.data = (void *)0x0;
                  local_128.refcount._0_4_ = 0;
                  local_128.refcount._4_4_ = 0;
                  local_128.elemsize._0_4_ = 0;
                  local_128.elemsize._4_4_ = 0;
                  local_128.elempack = 0;
                  local_128.dims = 0;
                  local_128.w = 0;
                  local_128.h = 0;
                  local_128.d = 0;
                  local_128.c = 0;
                  iVar32 = iVar32 + TILE_K_1;
                } while (iVar32 < iVar10);
              }
              if ((int)local_298 != 0) {
                transpose_unpack_output_tile
                          (&local_288,pMVar26,(int)local_2c8,(int)local_300,iVar17,(int)local_308);
              }
              iVar17 = iVar17 + TILE_K;
              iVar32 = local_2dc;
            } while (iVar17 < local_2dc);
          }
          this = local_130;
          piVar18 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + -1;
            UNLOCK();
            if (*piVar18 == 0) {
              if (local_288.allocator == (Allocator *)0x0) {
                if (local_288.data != (void *)0x0) {
                  free(local_288.data);
                }
              }
              else {
                (*(local_288.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_288.cstep = 0;
          local_288.data = (void *)0x0;
          local_288.refcount._0_4_ = 0;
          local_288.refcount._4_4_ = 0;
          local_288.elemsize._0_4_ = 0;
          local_288.elemsize._4_4_ = 0;
          local_288.elempack = 0;
          local_288.dims = 0;
          local_288.w = 0;
          local_288.h = 0;
          local_288.d = 0;
          local_288.c = 0;
          local_2cc = local_2cc + 1;
        } while (local_2cc != (int)local_138);
      }
      piVar18 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if (local_238.allocator == (Allocator *)0x0) {
            if (local_238.data != (void *)0x0) {
              free(local_238.data);
            }
          }
          else {
            (*(local_238.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_238.cstep = 0;
      local_238.data = (void *)0x0;
      local_238.refcount._0_4_ = 0;
      local_238.refcount._4_4_ = 0;
      local_238.elemsize._0_4_ = 0;
      local_238.elemsize._4_4_ = 0;
      local_238.elempack = 0;
      local_238.dims = 0;
      local_238.w = 0;
      local_238.h = 0;
      local_238.d = 0;
      local_238.c = 0;
      piVar18 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if (local_188.allocator == (Allocator *)0x0) {
joined_r0x004e830a:
            local_238.d = 0;
            local_238.h = 0;
            local_238.w = 0;
            local_238.dims = 0;
            local_238.elempack = 0;
            local_238.elemsize._4_4_ = 0;
            local_238.elemsize._0_4_ = 0;
            local_238.refcount._4_4_ = 0;
            local_238.refcount._0_4_ = 0;
            local_238.c = 0;
            local_238.data = (void *)0x0;
            local_238.cstep = 0;
            if (local_188.data != (void *)0x0) {
              local_238.cstep = 0;
              local_238.c = 0;
              local_238.d = 0;
              local_238.h = 0;
              local_238.w = 0;
              local_238.dims = 0;
              local_238.elempack = 0;
              local_238.elemsize._4_4_ = 0;
              local_238.elemsize._0_4_ = 0;
              local_238.refcount._4_4_ = 0;
              local_238.refcount._0_4_ = 0;
              local_238.data = (void *)0x0;
              free(local_188.data);
            }
          }
          else {
            (*(local_188.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  else if (*(int *)((long)&(this->CT_data).cstep + (long)(p_Var1 + 4)) == 0) {
    if (iVar32 == 0) goto LAB_004e6494;
    local_300 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_300->data)->_M_impl)
                .super__Vector_impl_data._M_start;
    iVar32 = *(int *)(&(this->CT_data).field_0x3c + (long)p_Var1);
    uVar12 = *(uint *)(&this->field_0xec + (long)p_Var1);
    uVar25 = *(uint *)(&this->field_0xf4 + (long)p_Var1);
    local_2d8 = (pointer)(ulong)uVar25;
    local_2c8 = (Allocator *)CONCAT44(local_2c8._4_4_,iVar32);
    if (iVar32 == 0) {
      uVar31 = local_300->w;
    }
    else {
      uVar31 = local_300->elempack * (&local_300->h)[(ulong)(local_300->dims == 3) * 2];
    }
    local_2dc = *(int *)(&this->field_0x108 + (long)p_Var1);
    local_308 = (Mat *)opt;
    local_2a0 = (Allocator *)(ulong)uVar30;
    get_optimal_tile_mnk
              (uVar12,uVar31,uVar25,*(int *)(&this->field_0x10c + (long)p_Var1),
               *(int *)(&this->field_0x110 + (long)p_Var1),
               *(int *)(&this->field_0x114 + (long)p_Var1),&TILE_N,&TILE_K,&TILE_K_1,uVar30);
    local_138 = CONCAT44(local_138._4_4_,(int)(uVar12 + TILE_N + -1) / TILE_N);
    iVar9 = (int)(TILE_K + uVar31 + -1) / TILE_K;
    iVar10 = (int)(uVar25 + TILE_K_1 + -1) / TILE_K_1;
    local_188.cstep = 0;
    local_188.data = (void *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize._0_4_ = 0;
    local_188.elemsize._4_4_ = 0;
    local_188.elempack = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
    Mat::create(&local_188,TILE_K_1 * TILE_K,iVar10,iVar9,4,opt->workspace_allocator);
    iVar17 = TILE_K_1;
    iVar32 = TILE_K;
    iVar9 = iVar9 * iVar10;
    local_298 = (ulong)uVar31;
    local_198 = (ulong)uVar12;
    if (0 < iVar9) {
      iVar13 = 0;
      do {
        iVar16 = iVar32 * (iVar13 / iVar10);
        iVar22 = iVar17 * (int)((long)iVar13 % (long)iVar10);
        iVar14 = (int)local_298 - iVar16;
        if (iVar32 < iVar14) {
          iVar14 = iVar32;
        }
        max_kk = (int)local_2d8 - iVar22;
        if (iVar17 < max_kk) {
          max_kk = iVar17;
        }
        local_238.cstep = (size_t)local_188.w;
        local_238.data =
             (void *)((long)local_188.data +
                     ((long)iVar13 % (long)iVar10 & 0xffffffffU) * local_238.cstep *
                     CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize) +
                     (long)(iVar13 / iVar10) * local_188.cstep *
                     CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize));
        local_238.refcount._0_4_ = 0;
        local_238.refcount._4_4_ = 0;
        local_238.elemsize._0_4_ = (int)local_188.elemsize;
        local_238.elemsize._4_4_ = local_188.elemsize._4_4_;
        local_238.elempack = local_188.elempack;
        local_238.allocator = local_188.allocator;
        local_238.dims = 2;
        local_238.w = local_188.w;
        local_238.h = 1;
        local_238.d = 1;
        local_238.c = 1;
        if ((int)local_2c8 == 0) {
          transpose_pack_B_tile(local_300,&local_238,iVar16,iVar14,iVar22,max_kk);
        }
        else {
          pack_B_tile(local_300,&local_238,iVar16,iVar14,iVar22,max_kk);
        }
        iVar13 = iVar13 + 1;
      } while (iVar9 != iVar13);
    }
    pMVar20 = local_2d8;
    local_238.cstep = 0;
    local_238.data = (void *)0x0;
    local_238.refcount._0_4_ = 0;
    local_238.refcount._4_4_ = 0;
    local_238.elemsize._0_4_ = 0;
    local_238.elemsize._4_4_ = 0;
    local_238.elempack = 0;
    local_238.allocator = (Allocator *)0x0;
    local_238.dims = 0;
    local_238.w = 0;
    local_238.h = 0;
    local_238.d = 0;
    local_238.c = 0;
    if (((local_2dc != 0) || ((int)local_2b8 == 3)) || (TILE_K_1 < (int)local_2d8)) {
      Mat::create(&local_238,TILE_N * TILE_K,1,(int)local_2a0,4,(Allocator *)local_308->elemsize);
    }
    this = local_130;
    pMVar26 = local_290;
    if (0 < (int)local_138) {
      local_240 = CONCAT71(local_240._1_7_,local_2dc == 0);
      iVar32 = 0;
      uVar21 = local_298;
      do {
        local_2f8 = (Mat *)(ulong)(uint)(TILE_N * iVar32);
        uVar12 = (int)local_198 - TILE_N * iVar32;
        if (TILE_N < (int)uVar12) {
          uVar12 = TILE_N;
        }
        local_2e8 = (ulong)uVar12;
        local_288.cstep = 0;
        local_288.data = (void *)0x0;
        local_288.refcount._0_4_ = 0;
        local_288.refcount._4_4_ = 0;
        local_288.elemsize._0_4_ = 0;
        local_288.elemsize._4_4_ = 0;
        local_288.elempack = 0;
        local_288.h = 0;
        local_288.d = 0;
        local_288.c = 0;
        local_288.allocator = (Allocator *)0x0;
        local_288.dims = 0;
        local_288.w = 0;
        local_2cc = iVar32;
        if (((local_2dc != 0) || ((int)local_2b8 == 3)) || (TILE_K_1 < (int)pMVar20)) {
          iVar10 = get_omp_thread_num();
          iVar17 = local_238.d;
          iVar32 = local_238.dims;
          uVar8 = local_238.elemsize._4_4_;
          uVar7 = (undefined4)local_238.elemsize;
          pMVar24 = (pointer)(long)local_238.w;
          pAVar27 = (Allocator *)(long)local_238.h;
          uVar21 = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
          pvVar33 = (void *)((long)iVar10 * local_238.cstep * uVar21 + (long)local_238.data);
          uVar11 = uVar21 * (long)pAVar27 * (long)pMVar24 + 0xf & 0xfffffffffffffff0;
          uVar19 = uVar11 / uVar21;
          if (local_238.dims == 4) {
            uVar19 = (long)pAVar27 * (long)pMVar24;
          }
          piVar18 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          pAVar29 = local_238.allocator;
          iVar10 = local_238.elempack;
          iVar9 = local_238.w;
          iVar13 = local_238.h;
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + -1;
            UNLOCK();
            if (*piVar18 == 0) {
              if (local_288.allocator == (Allocator *)0x0) {
                if (local_288.data != (void *)0x0) {
                  local_308 = (Mat *)CONCAT44(local_308._4_4_,local_238.elempack);
                  local_2a0 = local_238.allocator;
                  local_300 = pMVar24;
                  local_2c8 = pAVar27;
                  free(local_288.data);
                  iVar13 = (int)local_2c8;
                  iVar9 = (int)local_300;
                  pAVar29 = local_2a0;
                  iVar10 = (int)local_308;
                }
              }
              else {
                local_308 = (Mat *)CONCAT44(local_308._4_4_,local_238.elempack);
                local_2a0 = local_238.allocator;
                local_300 = pMVar24;
                local_2c8 = pAVar27;
                (*(local_288.allocator)->_vptr_Allocator[3])
                          (local_288.allocator,local_288.data,uVar11 % uVar21);
                pAVar29 = local_2a0;
                iVar10 = (int)local_308;
                iVar9 = (int)local_300;
                iVar13 = (int)local_2c8;
              }
            }
          }
          local_288.dims = iVar32 + -1;
          local_288.elemsize._0_4_ = uVar7;
          local_288.elemsize._4_4_ = uVar8;
          local_288.d = 1;
          local_288.c = iVar17;
          pMVar26 = local_290;
          uVar21 = local_298;
          local_288.data = pvVar33;
          local_288.elempack = iVar10;
          local_288.allocator = pAVar29;
          local_288.w = iVar9;
          local_288.h = iVar13;
          local_288.cstep = uVar19;
        }
        local_288.refcount._4_4_ = 0;
        local_288.refcount._0_4_ = 0;
        if (0 < (int)uVar21) {
          pAVar27 = (Allocator *)0x0;
          do {
            uVar12 = (int)uVar21 - (int)pAVar27;
            if (TILE_K < (int)uVar12) {
              uVar12 = TILE_K;
            }
            local_300 = (pointer)(ulong)uVar12;
            local_308 = &local_1e8;
            if ((int)local_2b8 == 3) {
              pack_A_tile(&local_1e8,&local_288,(int)local_2f8,(int)local_2e8,(int)pAVar27,uVar12);
              local_308 = &local_288;
            }
            local_2c8 = pAVar27;
            if (0 < (int)pMVar20) {
              iVar32 = 0;
              pMVar24 = pMVar20;
              do {
                pMVar20 = local_2d8;
                iVar17 = (int)pMVar24 - iVar32;
                if (TILE_K_1 < iVar17) {
                  iVar17 = TILE_K_1;
                }
                sVar23 = (local_130->AT_data).elemsize;
                local_128.w = (local_130->AT_data).w;
                local_128.cstep = (size_t)local_128.w;
                local_128.elempack = (local_130->AT_data).elempack;
                local_128.allocator = (local_130->AT_data).allocator;
                local_128.data =
                     (void *)((long)(local_130->AT_data).data +
                             sVar23 * local_128.cstep * (long)(iVar32 / TILE_K_1) +
                             (long)(int)((long)((ulong)(uint)((int)local_2f8 >> 0x1f) << 0x20 |
                                               (ulong)local_2f8 & 0xffffffff) / (long)TILE_N) *
                             (local_130->AT_data).cstep * sVar23);
                local_128.refcount._0_4_ = 0;
                local_128.refcount._4_4_ = 0;
                local_128.elemsize._0_4_ = (undefined4)sVar23;
                local_128.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
                local_128.dims = 2;
                local_128.h = 1;
                local_128.d = 1;
                local_128.c = 1;
                local_98 = (size_t)local_188.w;
                _TILE_M = (void *)((long)local_188.data +
                                  local_98 *
                                  CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize) *
                                  (long)(iVar32 / TILE_K_1) +
                                  (long)(int)((long)((ulong)(uint)((int)local_2c8 >> 0x1f) << 0x20 |
                                                    (ulong)local_2c8 & 0xffffffff) / (long)TILE_K) *
                                  local_188.cstep *
                                  CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize));
                uStack_d0 = 0;
                uStack_cc = 0;
                local_c8 = (int)local_188.elemsize;
                uStack_c4 = local_188.elemsize._4_4_;
                local_c0 = local_188.elempack;
                local_b8 = local_188.allocator;
                local_b0._4_4_ = local_188.w;
                local_b0._0_4_ = 2;
                uStack_a8._0_4_ = 1;
                uStack_a8._4_4_ = 1;
                local_a0 = 1;
                iVar10 = (int)local_2d8;
                gemm_transB_packed_tile
                          (&local_128,(Mat *)&TILE_M,local_308,&local_288,local_290,(int)local_2b8,
                           (int)local_2f8,(int)local_2e8,(int)local_2c8,(int)local_300,iVar32,iVar17
                           ,(bool)(iVar10 <= TILE_K_1 + iVar32 & (byte)local_240));
                local_98 = 0;
                _TILE_M = (void *)0x0;
                uStack_d0 = 0;
                uStack_cc = 0;
                local_c8 = 0;
                uStack_c4 = 0;
                local_c0 = 0;
                local_b0._0_4_ = 0;
                local_b0._4_4_ = 0;
                uStack_a8._0_4_ = 0;
                uStack_a8._4_4_ = 0;
                local_a0 = 0;
                piVar18 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
                if (piVar18 != (int *)0x0) {
                  LOCK();
                  *piVar18 = *piVar18 + -1;
                  UNLOCK();
                  if (*piVar18 == 0) {
                    if (local_128.allocator == (Allocator *)0x0) {
                      if (local_128.data != (void *)0x0) {
                        free(local_128.data);
                      }
                    }
                    else {
                      (*(local_128.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_128.cstep = 0;
                local_128.data = (void *)0x0;
                local_128.refcount._0_4_ = 0;
                local_128.refcount._4_4_ = 0;
                local_128.elemsize._0_4_ = 0;
                local_128.elemsize._4_4_ = 0;
                local_128.elempack = 0;
                local_128.dims = 0;
                local_128.w = 0;
                local_128.h = 0;
                local_128.d = 0;
                local_128.c = 0;
                iVar32 = iVar32 + TILE_K_1;
                pMVar24 = pMVar20;
              } while (iVar32 < iVar10);
            }
            pMVar26 = local_290;
            iVar32 = (int)local_2c8;
            if (local_2dc != 0) {
              transpose_unpack_output_tile
                        (&local_288,local_290,(int)local_2f8,(int)local_2e8,iVar32,(int)local_300);
            }
            uVar12 = iVar32 + TILE_K;
            pAVar27 = (Allocator *)(ulong)uVar12;
            uVar21 = local_298;
          } while ((int)uVar12 < (int)local_298);
        }
        this = local_130;
        piVar18 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if (local_288.allocator == (Allocator *)0x0) {
              if (local_288.data != (void *)0x0) {
                free(local_288.data);
              }
            }
            else {
              (*(local_288.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_288.cstep = 0;
        local_288.data = (void *)0x0;
        local_288.refcount._0_4_ = 0;
        local_288.refcount._4_4_ = 0;
        local_288.elemsize._0_4_ = 0;
        local_288.elemsize._4_4_ = 0;
        local_288.elempack = 0;
        local_288.dims = 0;
        local_288.w = 0;
        local_288.h = 0;
        local_288.d = 0;
        local_288.c = 0;
        iVar32 = local_2cc + 1;
      } while (iVar32 != (int)local_138);
    }
    piVar18 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        if (local_238.allocator == (Allocator *)0x0) {
          if (local_238.data != (void *)0x0) {
            free(local_238.data);
          }
        }
        else {
          (*(local_238.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_238.cstep = 0;
    local_238.data = (void *)0x0;
    local_238.refcount._0_4_ = 0;
    local_238.refcount._4_4_ = 0;
    local_238.elemsize._0_4_ = 0;
    local_238.elemsize._4_4_ = 0;
    local_238.elempack = 0;
    local_238.dims = 0;
    local_238.w = 0;
    local_238.h = 0;
    local_238.d = 0;
    local_238.c = 0;
    piVar18 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        if (local_188.allocator == (Allocator *)0x0) goto joined_r0x004e830a;
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    uVar12 = *(uint *)(&this->field_0xec + (long)p_Var1);
    iVar32 = *(int *)(&this->field_0xf4 + (long)p_Var1);
    iVar17 = *(int *)(&this->field_0x108 + (long)p_Var1);
    local_298 = CONCAT44(local_298._4_4_,*(int *)(&this->field_0xf0 + (long)p_Var1));
    local_308 = (Mat *)opt;
    get_optimal_tile_mnk
              (uVar12,*(int *)(&this->field_0xf0 + (long)p_Var1),iVar32,
               *(int *)(&this->field_0x10c + (long)p_Var1),
               *(int *)(&this->field_0x110 + (long)p_Var1),
               *(int *)(&this->field_0x114 + (long)p_Var1),&TILE_M,&TILE_N,&TILE_K,uVar30);
    local_2cc = (int)(uVar12 + TILE_M + -1) / TILE_M;
    local_188.cstep = 0;
    local_188.data = (void *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize._0_4_ = 0;
    local_188.elemsize._4_4_ = 0;
    local_188.elempack = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
    local_240 = CONCAT44(local_240._4_4_,iVar17);
    iVar10 = (int)local_2b8;
    local_138 = (ulong)uVar12;
    if (((iVar17 != 0) || ((int)local_2b8 == 3)) || (TILE_K < iVar32)) {
      Mat::create(&local_188,TILE_M * TILE_N,1,uVar30,4,(Allocator *)local_308->elemsize);
    }
    if (0 < local_2cc) {
      local_2d8 = (pointer)CONCAT71(local_2d8._1_7_,(int)local_240 == 0);
      iVar13 = 0;
      iVar17 = (int)local_240;
      iVar9 = (int)local_298;
      do {
        local_300 = (pointer)(ulong)(uint)(TILE_M * iVar13);
        uVar12 = (int)local_138 - TILE_M * iVar13;
        if (TILE_M < (int)uVar12) {
          uVar12 = TILE_M;
        }
        local_2e8 = (ulong)uVar12;
        local_238.cstep = 0;
        local_238.data = (void *)0x0;
        local_238.refcount._0_4_ = 0;
        local_238.refcount._4_4_ = 0;
        local_238.elemsize._0_4_ = 0;
        local_238.elemsize._4_4_ = 0;
        local_238.elempack = 0;
        local_238.h = 0;
        local_238.d = 0;
        local_238.c = 0;
        local_238.allocator = (Allocator *)0x0;
        local_238.dims = 0;
        local_238.w = 0;
        local_2dc = iVar13;
        if (((iVar17 != 0) || (iVar10 == 3)) || (TILE_K < iVar32)) {
          iVar9 = get_omp_thread_num();
          iVar17 = local_188.dims;
          uVar8 = local_188.elemsize._4_4_;
          uVar7 = (int)local_188.elemsize;
          pMVar26 = (Mat *)(long)local_188.w;
          uVar28 = (ulong)local_188.h;
          uVar21 = CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize);
          pvVar33 = (void *)((long)iVar9 * local_188.cstep * uVar21 + (long)local_188.data);
          uVar11 = uVar21 * uVar28 * (long)pMVar26 + 0xf & 0xfffffffffffffff0;
          uVar19 = uVar11 / uVar21;
          if (local_188.dims == 4) {
            uVar19 = uVar28 * (long)pMVar26;
          }
          piVar18 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
          pAVar27 = local_188.allocator;
          iVar13 = local_188.elempack;
          iVar14 = local_188.w;
          iVar16 = local_188.h;
          iVar22 = local_188.d;
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + -1;
            UNLOCK();
            if (*piVar18 == 0) {
              local_2c8 = local_188.allocator;
              if (local_238.allocator == (Allocator *)0x0) {
                if (local_238.data != (void *)0x0) {
                  local_308 = (Mat *)CONCAT44(local_308._4_4_,local_188.d);
                  local_2a0 = (Allocator *)CONCAT44(local_2a0._4_4_,local_188.elempack);
                  local_2f8 = pMVar26;
                  local_198 = uVar28;
                  free(local_238.data);
                  iVar16 = (int)local_198;
                  iVar14 = (int)local_2f8;
                  pAVar27 = local_2c8;
                  iVar13 = (int)local_2a0;
                  iVar22 = (int)local_308;
                }
              }
              else {
                local_308 = (Mat *)CONCAT44(local_308._4_4_,local_188.d);
                local_2a0 = (Allocator *)CONCAT44(local_2a0._4_4_,local_188.elempack);
                local_2f8 = pMVar26;
                local_198 = uVar28;
                (*(local_238.allocator)->_vptr_Allocator[3])
                          (local_238.allocator,local_238.data,uVar11 % uVar21);
                pAVar27 = local_2c8;
                iVar13 = (int)local_2a0;
                iVar14 = (int)local_2f8;
                iVar16 = (int)local_198;
                iVar22 = (int)local_308;
              }
            }
          }
          local_238.dims = iVar17 + -1;
          local_238.elemsize._0_4_ = uVar7;
          local_238.elemsize._4_4_ = uVar8;
          local_238.d = 1;
          pMVar26 = local_290;
          iVar9 = (int)local_298;
          local_238.data = pvVar33;
          local_238.elempack = iVar13;
          local_238.allocator = pAVar27;
          local_238.w = iVar14;
          local_238.h = iVar16;
          local_238.c = iVar22;
          local_238.cstep = uVar19;
        }
        local_238.refcount._4_4_ = 0;
        local_238.refcount._0_4_ = 0;
        if (0 < iVar9) {
          pAVar27 = (Allocator *)0x0;
          do {
            uVar12 = iVar9 - (int)pAVar27;
            if (TILE_N < (int)uVar12) {
              uVar12 = TILE_N;
            }
            local_308 = (Mat *)(ulong)uVar12;
            local_2f8 = &local_1e8;
            local_2c8 = pAVar27;
            if (iVar10 == 3) {
              pack_A_tile(&local_1e8,&local_238,(int)local_300,(int)local_2e8,(int)pAVar27,uVar12);
              local_2f8 = &local_238;
            }
            if (0 < iVar32) {
              iVar17 = 0;
              do {
                pMVar26 = local_290;
                iVar9 = iVar32 - iVar17;
                if (TILE_K < iVar32 - iVar17) {
                  iVar9 = TILE_K;
                }
                sVar23 = (local_130->AT_data).elemsize;
                local_288.w = (local_130->AT_data).w;
                local_288.cstep = (size_t)local_288.w;
                local_288.elempack = (local_130->AT_data).elempack;
                local_288.allocator = (local_130->AT_data).allocator;
                local_288.data =
                     (void *)((long)(local_130->AT_data).data +
                             sVar23 * local_288.cstep * (long)(iVar17 / TILE_K) +
                             (long)(int)((long)((ulong)(uint)((int)local_300 >> 0x1f) << 0x20 |
                                               (ulong)local_300 & 0xffffffff) / (long)TILE_M) *
                             (local_130->AT_data).cstep * sVar23);
                local_288.refcount._0_4_ = 0;
                local_288.refcount._4_4_ = 0;
                local_288.elemsize._0_4_ = (undefined4)sVar23;
                local_288.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
                local_288.dims = 2;
                local_288.h = 1;
                local_288.d = 1;
                local_288.c = 1;
                local_128.w = (local_130->BT_data).w;
                local_128.cstep = (size_t)local_128.w;
                sVar23 = (local_130->BT_data).elemsize;
                local_128.elempack = (local_130->BT_data).elempack;
                local_128.data =
                     (void *)((long)(local_130->BT_data).data +
                             local_128.cstep * sVar23 * (long)(iVar17 / TILE_K) +
                             (long)(int)((long)((ulong)(uint)((int)local_2c8 >> 0x1f) << 0x20 |
                                               (ulong)local_2c8 & 0xffffffff) / (long)TILE_N) *
                             (local_130->BT_data).cstep * sVar23);
                local_128.allocator = (local_130->BT_data).allocator;
                iVar10 = (int)local_2b8;
                local_128.refcount._0_4_ = 0;
                local_128.refcount._4_4_ = 0;
                local_128.elemsize._0_4_ = (undefined4)sVar23;
                local_128.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
                local_128.dims = 2;
                local_128.h = 1;
                local_128.d = 1;
                local_128.c = 1;
                gemm_transB_packed_tile
                          (&local_288,&local_128,local_2f8,&local_238,local_290,(int)local_2b8,
                           (int)local_300,(int)local_2e8,(int)local_2c8,(int)local_308,iVar17,iVar9,
                           (bool)(iVar32 <= TILE_K + iVar17 & (byte)local_2d8));
                local_128.cstep = 0;
                local_128.data = (void *)0x0;
                local_128.refcount._0_4_ = 0;
                local_128.refcount._4_4_ = 0;
                local_128.elemsize._0_4_ = 0;
                local_128.elemsize._4_4_ = 0;
                local_128.elempack = 0;
                local_128.dims = 0;
                local_128.w = 0;
                local_128.h = 0;
                local_128.d = 0;
                local_128.c = 0;
                piVar18 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
                if (piVar18 != (int *)0x0) {
                  LOCK();
                  *piVar18 = *piVar18 + -1;
                  UNLOCK();
                  if (*piVar18 == 0) {
                    if (local_288.allocator == (Allocator *)0x0) {
                      if (local_288.data != (void *)0x0) {
                        free(local_288.data);
                      }
                    }
                    else {
                      (*(local_288.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_288.cstep = 0;
                local_288.data = (void *)0x0;
                local_288.refcount._0_4_ = 0;
                local_288.refcount._4_4_ = 0;
                local_288.elemsize._0_4_ = 0;
                local_288.elemsize._4_4_ = 0;
                local_288.elempack = 0;
                local_288.dims = 0;
                local_288.w = 0;
                local_288.h = 0;
                local_288.d = 0;
                local_288.c = 0;
                iVar17 = iVar17 + TILE_K;
              } while (iVar17 < iVar32);
            }
            iVar17 = (int)local_2c8;
            if ((int)local_240 != 0) {
              transpose_unpack_output_tile
                        (&local_238,pMVar26,(int)local_300,(int)local_2e8,iVar17,(int)local_308);
            }
            uVar12 = iVar17 + TILE_N;
            pAVar27 = (Allocator *)(ulong)uVar12;
            iVar9 = (int)local_298;
          } while ((int)uVar12 < (int)local_298);
        }
        piVar18 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        iVar17 = (int)local_240;
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if (local_238.allocator == (Allocator *)0x0) {
              if (local_238.data != (void *)0x0) {
                free(local_238.data);
              }
            }
            else {
              (*(local_238.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_238.cstep = 0;
        local_238.data = (void *)0x0;
        local_238.refcount._0_4_ = 0;
        local_238.refcount._4_4_ = 0;
        local_238.elemsize._0_4_ = 0;
        local_238.elemsize._4_4_ = 0;
        local_238.elempack = 0;
        local_238.dims = 0;
        local_238.w = 0;
        local_238.h = 0;
        local_238.d = 0;
        local_238.c = 0;
        iVar13 = local_2dc + 1;
      } while (iVar13 != local_2cc);
    }
    this = local_130;
    piVar18 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
joined_r0x004e84da:
          if (local_188.data != (void *)0x0) {
            free(local_188.data);
          }
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_188.cstep = 0;
  local_188.data = (void *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.elemsize._0_4_ = 0;
  local_188.elemsize._4_4_ = 0;
  local_188.elempack = 0;
  local_188.dims = 0;
  local_188.w = 0;
  local_188.h = 0;
  local_188.d = 0;
  local_188.c = 0;
  pp_Var2 = this->_vptr_Gemm_x86_avx512;
  iVar32 = 0;
  if ((*(float *)((long)&(this->CT_data).h + (long)pp_Var2[-3]) != 1.0) &&
     (uVar12 = (int)local_38 * (int)pMVar26->cstep * pMVar26->c, iVar32 = 0, 0 < (int)uVar12)) {
    pvVar33 = pMVar26->data;
    iVar32 = 0;
    uVar21 = 0;
    do {
      *(float *)((long)pvVar33 + uVar21 * 4) =
           *(float *)((long)pvVar33 + uVar21 * 4) *
           *(float *)((long)&(this->CT_data).h + (long)pp_Var2[-3]);
      uVar21 = uVar21 + 1;
    } while (uVar12 != uVar21);
  }
LAB_004e86ed:
  piVar18 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_1e8.allocator == (Allocator *)0x0) {
        if (local_1e8.data != (void *)0x0) {
          free(local_1e8.data);
        }
      }
      else {
        (*(local_1e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar32;
}

Assistant:

int Gemm_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return ret;
}